

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O0

void anon_unknown.dwarf_113f::zsp
               (Array2D<Imath_3_2::half> *gpx,Array2D<float> *zpx,int w,int h,float xc,float yc,
               float zc,float rc,float gn)

{
  float *pfVar1;
  int in_ECX;
  int in_EDX;
  Array2D<float> *in_RSI;
  Array2D<Imath_3_2::half> *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float dg;
  float hl;
  float dl;
  float zp;
  float zl;
  float r;
  float yl;
  float xl;
  int y;
  int x;
  int y2;
  int y1;
  int x2;
  int x1;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff74;
  float local_7c;
  int local_64;
  int local_60;
  float local_5c;
  float local_58;
  int local_54;
  float local_50;
  float local_4c;
  int local_48;
  float local_44;
  float local_40;
  int local_3c;
  float local_38;
  float local_34;
  int local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  int local_18;
  int local_14;
  Array2D<float> *local_10;
  Array2D<Imath_3_2::half> *local_8;
  
  local_2c = in_XMM4_Da;
  local_28 = in_XMM3_Da;
  local_24 = in_XMM2_Da;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  dVar5 = std::floor((double)(ulong)(uint)(in_XMM0_Da - in_XMM3_Da));
  local_34 = SUB84(dVar5,0);
  local_38 = 0.0;
  pfVar1 = std::max<float>(&local_34,&local_38);
  local_30 = (int)*pfVar1;
  dVar5 = std::ceil((double)(ulong)(uint)(local_1c + local_28));
  local_40 = SUB84(dVar5,0);
  local_44 = (float)local_14 - 1.0;
  pfVar1 = std::min<float>(&local_40,&local_44);
  local_3c = (int)*pfVar1;
  dVar5 = std::floor((double)(ulong)(uint)(local_20 - local_28));
  local_4c = SUB84(dVar5,0);
  local_50 = 0.0;
  pfVar1 = std::max<float>(&local_4c,&local_50);
  local_48 = (int)*pfVar1;
  dVar5 = std::ceil((double)(ulong)(uint)(local_20 + local_28));
  local_58 = SUB84(dVar5,0);
  local_5c = (float)local_18 - 1.0;
  pfVar1 = std::min<float>(&local_58,&local_5c);
  local_54 = (int)*pfVar1;
  for (local_60 = local_30; local_60 <= local_3c; local_60 = local_60 + 1) {
    for (local_64 = local_48; local_64 <= local_54; local_64 = local_64 + 1) {
      fVar2 = ((float)local_60 - local_1c) / local_28;
      fVar3 = ((float)local_64 - local_20) / local_28;
      dVar5 = std::sqrt((double)(ulong)(uint)(fVar2 * fVar2 + fVar3 * fVar3));
      fVar4 = SUB84(dVar5,0);
      if (fVar4 < 1.0) {
        dVar5 = std::sqrt((double)(ulong)(uint)(-fVar4 * fVar4 + 1.0));
        fVar4 = -local_28 * SUB84(dVar5,0) + local_24;
        pfVar1 = Imf_3_4::Array2D<float>::operator[](local_10,(long)local_64);
        if (fVar4 < pfVar1[local_60]) {
          local_7c = SUB84(dVar5,0) * 0.7071 + fVar2 * 0.42426 + -(fVar3 * 0.56568);
          if (local_7c < 0.0) {
            local_7c = local_7c * -0.1;
          }
          fVar2 = pw(local_7c,0x32);
          fVar2 = (local_7c + fVar2 * 4.0) * local_2c;
          Imf_3_4::Array2D<Imath_3_2::half>::operator[](local_8,(long)local_64);
          Imath_3_2::half::operator=
                    ((half *)CONCAT44(in_stack_ffffffffffffff74,fVar2),in_stack_ffffffffffffff6c);
          pfVar1 = Imf_3_4::Array2D<float>::operator[](local_10,(long)local_64);
          pfVar1[local_60] = fVar4;
          in_stack_ffffffffffffff74 = fVar4;
        }
      }
    }
  }
  return;
}

Assistant:

void
zsp (
    Array2D<half>&  gpx,
    Array2D<float>& zpx,
    int             w,
    int             h,
    float           xc,
    float           yc,
    float           zc,
    float           rc,
    float           gn)
{
    int x1 = int (max ((float) floor (xc - rc), 0.0f));
    int x2 = int (min ((float) ceil (xc + rc), w - 1.0f));
    int y1 = int (max ((float) floor (yc - rc), 0.0f));
    int y2 = int (min ((float) ceil (yc + rc), h - 1.0f));

    for (int x = x1; x <= x2; ++x)
    {
        for (int y = y1; y <= y2; ++y)
        {
            float xl = (x - xc) / rc;
            float yl = (y - yc) / rc;
            float r  = sqrt (xl * xl + yl * yl);

            if (r >= 1) continue;

            float zl = sqrt (1 - r * r);
            float zp = zc - rc * zl;

            if (zp >= zpx[y][x]) continue;

            float dl = xl * 0.42426 - yl * 0.56568 + zl * 0.70710;

            if (dl < 0) dl *= -0.1;

            float hl = pw (dl, 50) * 4;
            float dg = (dl + hl) * gn;

            gpx[y][x] = dg;
            zpx[y][x] = zp;
        }
    }
}